

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves.cpp
# Opt level: O2

int __thiscall linkedMoveList::remove(linkedMoveList *this,char *__filename)

{
  int extraout_EAX;
  int iVar1;
  moveNode *pmVar2;
  moveNode *pmVar3;
  
  pmVar3 = this->head;
  if ((int)__filename == 0) {
    this->head = pmVar3->next;
  }
  else {
    iVar1 = 0;
    do {
      pmVar2 = pmVar3;
      pmVar3 = pmVar2->next;
      iVar1 = iVar1 + 1;
    } while (iVar1 < (int)__filename);
    pmVar2->next = pmVar3->next;
    if (pmVar3 == this->tail) {
      this->tail = pmVar2;
    }
  }
  operator_delete(pmVar3,0x10);
  return extraout_EAX;
}

Assistant:

void linkedMoveList::remove(int pos){
	if(pos == 0) {
		moveNode *temp = head;
		head = head->next;
		delete temp;
	} else {
		moveNode *current = head->next;
		moveNode *previous = head;
		for(int i = 1; i < pos; i++){
			previous = current;
			current = current->next;
		}
		previous->next = current->next;
		if(current == tail) tail = previous;
		delete current;
	}
}